

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::util_ParseByteUnits::test_method(util_ParseByteUnits *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  optional<unsigned_long> oVar3;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  check_type cVar4;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  ulong local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  ulong *local_c0;
  assertion_result local_b8;
  ulong **local_a0;
  _Storage<unsigned_long,_true> *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  _Storage<unsigned_long,_true> **local_78;
  char *local_70;
  char *local_68;
  assertion_result local_60;
  _Storage<unsigned_long,_true> local_48;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6ba;
  file.m_begin = (iterator)&local_d0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e0,msg);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013abb30;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  str._M_str = "1";
  str._M_len = 1;
  oVar3 = ParseByteUnits(str,NOOP);
  local_48._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  if (((undefined1  [16])
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    local_c0 = &local_148;
    local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_48._M_value == 1);
    local_148 = CONCAT44(local_148._4_4_,1);
    local_60.m_message.px = (element_type *)0x0;
    local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_68 = "";
    local_98 = &local_48;
    local_78 = &local_98;
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_c0;
    local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
    local_b8._0_8_ = &PTR__lazy_ostream_013abcf0;
    local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar1 = (iterator)0x1;
    pvVar2 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf74215,(size_t)&local_70,0x6ba,
               &local_90,"1",&local_b8);
    boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
    local_110 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_108 = "";
    local_120 = &boost::unit_test::basic_cstring<char_const>::null;
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x6bb;
    file_00.m_begin = (iterator)&local_110;
    msg_00.m_end = pvVar2;
    msg_00.m_begin = pvVar1;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
               msg_00);
    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
    local_100._0_8_ = &PTR__lazy_ostream_013abb30;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = "";
    str_00._M_str = "0";
    str_00._M_len = 1;
    oVar3 = ParseByteUnits(str_00,NOOP);
    local_48._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    if (((undefined1  [16])
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      local_148 = local_148 & 0xffffffff00000000;
      local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_48._M_value == 0);
      local_60.m_message.px = (element_type *)0x0;
      local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_70 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_68 = "";
      local_98 = &local_48;
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = &local_98;
      local_c0 = &local_148;
      local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
      local_b8._0_8_ = &PTR__lazy_ostream_013abcf0;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_a0 = &local_c0;
      pvVar1 = (iterator)0x1;
      pvVar2 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf74237,(size_t)&local_70,0x6bb,
                 &local_90,"0",&local_b8);
      boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
      local_130 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_128 = "";
      local_140 = &boost::unit_test::basic_cstring<char_const>::null;
      local_138 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x6bd;
      file_01.m_begin = (iterator)&local_130;
      msg_01.m_end = pvVar2;
      msg_01.m_begin = pvVar1;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_140,
                 msg_01);
      local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
      local_100._0_8_ = &PTR__lazy_ostream_013abb30;
      local_f0 = boost::unit_test::lazy_ostream::inst;
      local_e8 = "";
      str_01._M_str = "1k";
      str_01._M_len = 2;
      oVar3 = ParseByteUnits(str_01,NOOP);
      local_48._M_value =
           oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_engaged;
      if (((undefined1  [16])
           oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        local_148 = 1000;
        local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(local_48._M_value == 1000);
        local_60.m_message.px = (element_type *)0x0;
        local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_70 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_68 = "";
        local_98 = &local_48;
        local_90.m_empty = false;
        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
        local_80 = boost::unit_test::lazy_ostream::inst;
        local_78 = &local_98;
        local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
        local_b8._0_8_ = &PTR__lazy_ostream_013ad550;
        local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_a0 = &local_c0;
        pvVar1 = (iterator)0x1;
        pvVar2 = (iterator)0x2;
        local_c0 = &local_148;
        boost::test_tools::tt_detail::report_assertion
                  (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf7425c,(size_t)&local_70,0x6bd,
                   &local_90,"1000ULL",&local_b8);
        boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
        local_158 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_150 = "";
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        local_160 = &boost::unit_test::basic_cstring<char_const>::null;
        file_02.m_end = (iterator)0x6be;
        file_02.m_begin = (iterator)&local_158;
        msg_02.m_end = pvVar2;
        msg_02.m_begin = pvVar1;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_168
                   ,msg_02);
        local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
        local_100._0_8_ = &PTR__lazy_ostream_013abb30;
        local_f0 = boost::unit_test::lazy_ostream::inst;
        local_e8 = "";
        str_02._M_str = "1K";
        str_02._M_len = 2;
        oVar3 = ParseByteUnits(str_02,NOOP);
        local_48._M_value =
             oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_engaged;
        if (((undefined1  [16])
             oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          local_148 = 0x400;
          local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(local_48._M_value == 0x400);
          local_60.m_message.px = (element_type *)0x0;
          local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_70 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_68 = "";
          local_98 = &local_48;
          local_90.m_empty = false;
          local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
          local_80 = boost::unit_test::lazy_ostream::inst;
          local_78 = &local_98;
          local_b8.m_message.px =
               (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
          local_b8._0_8_ = &PTR__lazy_ostream_013ad550;
          local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_a0 = &local_c0;
          pvVar1 = (iterator)0x1;
          pvVar2 = (iterator)0x2;
          local_c0 = &local_148;
          boost::test_tools::tt_detail::report_assertion
                    (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf7428a,(size_t)&local_70,
                     0x6be,&local_90,"1ULL << 10",&local_b8);
          boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
          local_178 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_170 = "";
          local_188 = &boost::unit_test::basic_cstring<char_const>::null;
          local_180 = &boost::unit_test::basic_cstring<char_const>::null;
          file_03.m_end = (iterator)0x6c0;
          file_03.m_begin = (iterator)&local_178;
          msg_03.m_end = pvVar2;
          msg_03.m_begin = pvVar1;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_188,msg_03);
          local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
          local_100._0_8_ = &PTR__lazy_ostream_013abb30;
          local_f0 = boost::unit_test::lazy_ostream::inst;
          local_e8 = "";
          str_03._M_str = "2m";
          str_03._M_len = 2;
          oVar3 = ParseByteUnits(str_03,NOOP);
          local_48._M_value =
               oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_engaged;
          if (((undefined1  [16])
               oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            local_148 = 2000000;
            local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(local_48._M_value == 2000000);
            local_60.m_message.px = (element_type *)0x0;
            local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_70 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_68 = "";
            local_98 = &local_48;
            local_90.m_empty = false;
            local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
            local_80 = boost::unit_test::lazy_ostream::inst;
            local_78 = &local_98;
            local_b8.m_message.px =
                 (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
            local_b8._0_8_ = &PTR__lazy_ostream_013ad550;
            local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_a0 = &local_c0;
            pvVar1 = (iterator)0x1;
            pvVar2 = (iterator)0x2;
            local_c0 = &local_148;
            boost::test_tools::tt_detail::report_assertion
                      (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf742b8,(size_t)&local_70,
                       0x6c0,&local_90,"2\'000\'000ULL",&local_b8);
            boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
            local_198 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_190 = "";
            local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_04.m_end = (iterator)0x6c1;
            file_04.m_begin = (iterator)&local_198;
            msg_04.m_end = pvVar2;
            msg_04.m_begin = pvVar1;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                       (size_t)&local_1a8,msg_04);
            local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
            local_100._0_8_ = &PTR__lazy_ostream_013abb30;
            local_f0 = boost::unit_test::lazy_ostream::inst;
            local_e8 = "";
            str_04._M_str = "2M";
            str_04._M_len = 2;
            oVar3 = ParseByteUnits(str_04,NOOP);
            local_48._M_value =
                 oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload;
            local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_engaged;
            if (((undefined1  [16])
                 oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              local_148 = 0x200000;
              local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)(local_48._M_value == 0x200000);
              local_60.m_message.px = (element_type *)0x0;
              local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_70 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
              ;
              local_68 = "";
              local_98 = &local_48;
              local_90.m_empty = false;
              local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
              local_80 = boost::unit_test::lazy_ostream::inst;
              local_78 = &local_98;
              local_b8.m_message.px =
                   (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
              local_b8._0_8_ = &PTR__lazy_ostream_013ad550;
              local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_a0 = &local_c0;
              pvVar1 = (iterator)0x1;
              pvVar2 = (iterator)0x2;
              local_c0 = &local_148;
              boost::test_tools::tt_detail::report_assertion
                        (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf742e8,(size_t)&local_70,
                         0x6c1,&local_90,"2ULL << 20",&local_b8);
              boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
              local_1b8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
              ;
              local_1b0 = "";
              local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_05.m_end = (iterator)0x6c3;
              file_05.m_begin = (iterator)&local_1b8;
              msg_05.m_end = pvVar2;
              msg_05.m_begin = pvVar1;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                         (size_t)&local_1c8,msg_05);
              local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
              local_100._0_8_ = &PTR__lazy_ostream_013abb30;
              local_f0 = boost::unit_test::lazy_ostream::inst;
              local_e8 = "";
              str_05._M_str = "3g";
              str_05._M_len = 2;
              oVar3 = ParseByteUnits(str_05,NOOP);
              local_48._M_value =
                   oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload;
              local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_long>._M_engaged;
              if (((undefined1  [16])
                   oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_bad_optional_access();
                }
              }
              else {
                local_148 = 3000000000;
                local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
                value = (readonly_property<bool>)(local_48._M_value == 3000000000);
                local_60.m_message.px = (element_type *)0x0;
                local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_70 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                ;
                local_68 = "";
                local_98 = &local_48;
                local_90.m_empty = false;
                local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
                local_80 = boost::unit_test::lazy_ostream::inst;
                local_78 = &local_98;
                local_b8.m_message.px =
                     (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
                local_b8._0_8_ = &PTR__lazy_ostream_013ad550;
                local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_a0 = &local_c0;
                pvVar1 = (iterator)0x1;
                pvVar2 = (iterator)0x2;
                local_c0 = &local_148;
                boost::test_tools::tt_detail::report_assertion
                          (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf74316,
                           (size_t)&local_70,0x6c3,&local_90,"3\'000\'000\'000ULL",&local_b8);
                boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
                local_1d8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                ;
                local_1d0 = "";
                local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
                file_06.m_end = (iterator)0x6c4;
                file_06.m_begin = (iterator)&local_1d8;
                msg_06.m_end = pvVar2;
                msg_06.m_begin = pvVar1;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                           (size_t)&local_1e8,msg_06);
                local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
                local_100._0_8_ = &PTR__lazy_ostream_013abb30;
                local_f0 = boost::unit_test::lazy_ostream::inst;
                local_e8 = "";
                str_06._M_str = "3G";
                str_06._M_len = 2;
                oVar3 = ParseByteUnits(str_06,NOOP);
                local_48._M_value =
                     oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_payload;
                local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long>._M_engaged;
                if (((undefined1  [16])
                     oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    std::__throw_bad_optional_access();
                  }
                }
                else {
                  local_148 = 0xc0000000;
                  local_60.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)(local_48._M_value == 0xc0000000);
                  local_60.m_message.px = (element_type *)0x0;
                  local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_70 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                  ;
                  local_68 = "";
                  local_98 = &local_48;
                  local_90.m_empty = false;
                  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
                  local_80 = boost::unit_test::lazy_ostream::inst;
                  local_78 = &local_98;
                  local_b8.m_message.px =
                       (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
                  local_b8._0_8_ = &PTR__lazy_ostream_013ad550;
                  local_b8.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_a0 = &local_c0;
                  pvVar1 = (iterator)0x1;
                  pvVar2 = (iterator)0x2;
                  local_c0 = &local_148;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf7434a,
                             (size_t)&local_70,0x6c4,&local_90,"3ULL << 30",&local_b8);
                  boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
                  local_1f8 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                  ;
                  local_1f0 = "";
                  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_07.m_end = (iterator)0x6c6;
                  file_07.m_begin = (iterator)&local_1f8;
                  msg_07.m_end = pvVar2;
                  msg_07.m_begin = pvVar1;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                             (size_t)&local_208,msg_07);
                  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
                  local_100._0_8_ = &PTR__lazy_ostream_013abb30;
                  local_f0 = boost::unit_test::lazy_ostream::inst;
                  local_e8 = "";
                  str_07._M_str = "4t";
                  str_07._M_len = 2;
                  oVar3 = ParseByteUnits(str_07,NOOP);
                  local_48._M_value =
                       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_payload;
                  local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_long>._M_engaged;
                  if (((undefined1  [16])
                       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      std::__throw_bad_optional_access();
                    }
                  }
                  else {
                    local_148 = 4000000000000;
                    local_60.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value =
                         (readonly_property<bool>)(local_48._M_value == 4000000000000);
                    local_60.m_message.px = (element_type *)0x0;
                    local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
                    local_70 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                    ;
                    local_68 = "";
                    local_98 = &local_48;
                    local_90.m_empty = false;
                    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
                    local_80 = boost::unit_test::lazy_ostream::inst;
                    local_78 = &local_98;
                    local_b8.m_message.px =
                         (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
                    local_b8._0_8_ = &PTR__lazy_ostream_013ad550;
                    local_b8.m_message.pn.pi_ =
                         (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                    local_a0 = &local_c0;
                    pvVar1 = (iterator)0x1;
                    pvVar2 = (iterator)0x2;
                    local_c0 = &local_148;
                    boost::test_tools::tt_detail::report_assertion
                              (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf74378,
                               (size_t)&local_70,0x6c6,&local_90,"4\'000\'000\'000\'000ULL",
                               &local_b8);
                    boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
                    local_218 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                    ;
                    local_210 = "";
                    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
                    file_08.m_end = (iterator)0x6c7;
                    file_08.m_begin = (iterator)&local_218;
                    msg_08.m_end = pvVar2;
                    msg_08.m_begin = pvVar1;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                               (size_t)&local_228,msg_08);
                    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
                    local_100._0_8_ = &PTR__lazy_ostream_013abb30;
                    local_f0 = boost::unit_test::lazy_ostream::inst;
                    local_e8 = "";
                    str_08._M_str = "4T";
                    str_08._M_len = 2;
                    oVar3 = ParseByteUnits(str_08,NOOP);
                    local_48._M_value =
                         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_long>._M_payload;
                    local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                               super__Optional_payload_base<unsigned_long>._M_engaged;
                    if (((undefined1  [16])
                         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                        (undefined1  [16])0x0) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        std::__throw_bad_optional_access();
                      }
                    }
                    else {
                      local_148 = 0x40000000000;
                      local_60.p_predicate_value.super_readonly_property<bool>.
                      super_class_property<bool>.value =
                           (readonly_property<bool>)(local_48._M_value == 0x40000000000);
                      local_60.m_message.px = (element_type *)0x0;
                      local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
                      local_70 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                      ;
                      local_68 = "";
                      local_98 = &local_48;
                      local_90.m_empty = false;
                      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
                      local_80 = boost::unit_test::lazy_ostream::inst;
                      local_78 = &local_98;
                      local_b8.m_message.px =
                           (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
                      local_b8._0_8_ = &PTR__lazy_ostream_013ad550;
                      local_b8.m_message.pn.pi_ =
                           (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                      local_a0 = &local_c0;
                      pvVar1 = (iterator)0x1;
                      pvVar2 = (iterator)0x2;
                      local_c0 = &local_148;
                      boost::test_tools::tt_detail::report_assertion
                                (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf743b3,
                                 (size_t)&local_70,0x6c7,&local_90,"4ULL << 40",&local_b8);
                      boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
                      local_238 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                      ;
                      local_230 = "";
                      local_248 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_240 = &boost::unit_test::basic_cstring<char_const>::null;
                      file_09.m_end = (iterator)0x6ca;
                      file_09.m_begin = (iterator)&local_238;
                      msg_09.m_end = pvVar2;
                      msg_09.m_begin = pvVar1;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                                 (size_t)&local_248,msg_09);
                      local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
                      local_100._0_8_ = &PTR__lazy_ostream_013abb30;
                      local_f0 = boost::unit_test::lazy_ostream::inst;
                      local_e8 = "";
                      str_09._M_str = "5";
                      str_09._M_len = 1;
                      oVar3 = ParseByteUnits(str_09,K);
                      local_48._M_value =
                           oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long>._M_payload;
                      local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_long>._M_engaged;
                      if (((undefined1  [16])
                           oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                          (undefined1  [16])0x0) {
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          std::__throw_bad_optional_access();
                        }
                      }
                      else {
                        local_148 = 0x1400;
                        local_60.p_predicate_value.super_readonly_property<bool>.
                        super_class_property<bool>.value =
                             (readonly_property<bool>)(local_48._M_value == 0x1400);
                        local_60.m_message.px = (element_type *)0x0;
                        local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_70 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_68 = "";
                        local_98 = &local_48;
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = &local_98;
                        local_b8.m_message.px =
                             (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
                        local_b8._0_8_ = &PTR__lazy_ostream_013ad550;
                        local_b8.m_message.pn.pi_ =
                             (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                        local_a0 = &local_c0;
                        pvVar1 = (iterator)0x1;
                        pvVar2 = (iterator)0x2;
                        local_c0 = &local_148;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf743e1,
                                   (size_t)&local_70,0x6ca,&local_90,"5ULL << 10",&local_b8);
                        boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
                        local_258 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_250 = "";
                        local_268 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_260 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_10.m_end = (iterator)0x6cd;
                        file_10.m_begin = (iterator)&local_258;
                        msg_10.m_end = pvVar2;
                        msg_10.m_begin = pvVar1;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                                   (size_t)&local_268,msg_10);
                        _cVar4 = 0x758dcb;
                        oVar3 = ParseByteUnits((string_view)(ZEXT816(0xf6cf21) << 0x40),NOOP);
                        local_b8._0_8_ =
                             CONCAT71(local_b8._1_7_,
                                      ~oVar3.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_b8.m_message.px = (element_type *)0x0;
                        local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_100._0_8_ = "!ParseByteUnits(\"\", noop)";
                        local_100._8_8_ = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = (_Storage<unsigned_long,_true> **)local_100;
                        local_278 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_270 = "";
                        pvVar1 = (iterator)0x1;
                        pvVar2 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_b8,&local_90,1,0,WARN,_cVar4,(size_t)&local_278,0x6cd);
                        boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
                        local_288 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_280 = "";
                        local_298 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_290 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_11.m_end = (iterator)0x6ce;
                        file_11.m_begin = (iterator)&local_288;
                        msg_11.m_end = pvVar2;
                        msg_11.m_begin = pvVar1;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                                   (size_t)&local_298,msg_11);
                        _cVar4 = 0x758ea8;
                        str_10._M_str = "foo";
                        str_10._M_len = 3;
                        oVar3 = ParseByteUnits(str_10,NOOP);
                        local_b8._0_8_ =
                             CONCAT71(local_b8._1_7_,
                                      ~oVar3.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_b8.m_message.px = (element_type *)0x0;
                        local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_100._0_8_ = "!ParseByteUnits(\"foo\", noop)";
                        local_100._8_8_ = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = (_Storage<unsigned_long,_true> **)local_100;
                        local_2a8 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_2a0 = "";
                        pvVar1 = (iterator)0x1;
                        pvVar2 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_b8,&local_90,1,0,WARN,_cVar4,(size_t)&local_2a8,0x6ce);
                        boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
                        local_2b8 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_2b0 = "";
                        local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_12.m_end = (iterator)0x6d1;
                        file_12.m_begin = (iterator)&local_2b8;
                        msg_12.m_end = pvVar2;
                        msg_12.m_begin = pvVar1;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                                   (size_t)&local_2c8,msg_12);
                        _cVar4 = 0x758f81;
                        str_11._M_str = "123m ";
                        str_11._M_len = 5;
                        oVar3 = ParseByteUnits(str_11,NOOP);
                        local_b8._0_8_ =
                             CONCAT71(local_b8._1_7_,
                                      ~oVar3.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_b8.m_message.px = (element_type *)0x0;
                        local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_100._0_8_ = "!ParseByteUnits(\"123m \", noop)";
                        local_100._8_8_ = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = (_Storage<unsigned_long,_true> **)local_100;
                        local_2d8 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_2d0 = "";
                        pvVar1 = (iterator)0x1;
                        pvVar2 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_b8,&local_90,1,0,WARN,_cVar4,(size_t)&local_2d8,0x6d1);
                        boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
                        local_2e8 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_2e0 = "";
                        local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_13.m_end = (iterator)0x6d2;
                        file_13.m_begin = (iterator)&local_2e8;
                        msg_13.m_end = pvVar2;
                        msg_13.m_begin = pvVar1;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                                   (size_t)&local_2f8,msg_13);
                        _cVar4 = 0x75905a;
                        str_12._M_str = " 123m";
                        str_12._M_len = 5;
                        oVar3 = ParseByteUnits(str_12,NOOP);
                        local_b8._0_8_ =
                             CONCAT71(local_b8._1_7_,
                                      ~oVar3.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_b8.m_message.px = (element_type *)0x0;
                        local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_100._0_8_ = "!ParseByteUnits(\" 123m\", noop)";
                        local_100._8_8_ = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = (_Storage<unsigned_long,_true> **)local_100;
                        local_308 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_300 = "";
                        pvVar1 = (iterator)0x1;
                        pvVar2 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_b8,&local_90,1,0,WARN,_cVar4,(size_t)&local_308,0x6d2);
                        boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
                        local_318 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_310 = "";
                        local_328 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_320 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_14.m_end = (iterator)0x6d5;
                        file_14.m_begin = (iterator)&local_318;
                        msg_14.m_end = pvVar2;
                        msg_14.m_begin = pvVar1;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                                   (size_t)&local_328,msg_14);
                        _cVar4 = 0x759133;
                        str_13._M_str = "-123m";
                        str_13._M_len = 5;
                        oVar3 = ParseByteUnits(str_13,NOOP);
                        local_b8._0_8_ =
                             CONCAT71(local_b8._1_7_,
                                      ~oVar3.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_b8.m_message.px = (element_type *)0x0;
                        local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_100._0_8_ = "!ParseByteUnits(\"-123m\", noop)";
                        local_100._8_8_ = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = (_Storage<unsigned_long,_true> **)local_100;
                        local_338 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_330 = "";
                        pvVar1 = (iterator)0x1;
                        pvVar2 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_b8,&local_90,1,0,WARN,_cVar4,(size_t)&local_338,0x6d5);
                        boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
                        local_348 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_340 = "";
                        local_358 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_350 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_15.m_end = (iterator)0x6d6;
                        file_15.m_begin = (iterator)&local_348;
                        msg_15.m_end = pvVar2;
                        msg_15.m_begin = pvVar1;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                                   (size_t)&local_358,msg_15);
                        _cVar4 = 0x75920c;
                        str_14._M_str = "+123m";
                        str_14._M_len = 5;
                        oVar3 = ParseByteUnits(str_14,NOOP);
                        local_b8._0_8_ =
                             CONCAT71(local_b8._1_7_,
                                      ~oVar3.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_b8.m_message.px = (element_type *)0x0;
                        local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_100._0_8_ = "!ParseByteUnits(\"+123m\", noop)";
                        local_100._8_8_ = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = (_Storage<unsigned_long,_true> **)local_100;
                        local_368 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_360 = "";
                        pvVar1 = (iterator)0x1;
                        pvVar2 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_b8,&local_90,1,0,WARN,_cVar4,(size_t)&local_368,0x6d6);
                        boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
                        local_378 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_370 = "";
                        local_388 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_380 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_16.m_end = (iterator)0x6d9;
                        file_16.m_begin = (iterator)&local_378;
                        msg_16.m_end = pvVar2;
                        msg_16.m_begin = pvVar1;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                                   (size_t)&local_388,msg_16);
                        local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
                        local_100._0_8_ = &PTR__lazy_ostream_013abb30;
                        local_f0 = boost::unit_test::lazy_ostream::inst;
                        local_e8 = "";
                        str_15._M_str = "020M";
                        str_15._M_len = 4;
                        oVar3 = ParseByteUnits(str_15,NOOP);
                        local_48._M_value =
                             oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_long>._M_payload;
                        local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                   super__Optional_payload_base<unsigned_long>._M_engaged;
                        if (((undefined1  [16])
                             oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                            (undefined1  [16])0x0) {
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            std::__throw_bad_optional_access();
                          }
                        }
                        else {
                          local_148 = 0x1400000;
                          local_60.p_predicate_value.super_readonly_property<bool>.
                          super_class_property<bool>.value =
                               (readonly_property<bool>)(local_48._M_value == 0x1400000);
                          local_60.m_message.px = (element_type *)0x0;
                          local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
                          local_70 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_68 = "";
                          local_98 = &local_48;
                          local_90.m_empty = false;
                          local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
                          local_80 = boost::unit_test::lazy_ostream::inst;
                          local_78 = &local_98;
                          local_c0 = &local_148;
                          local_b8.m_message.px =
                               (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
                          local_b8._0_8_ = &PTR__lazy_ostream_013ad550;
                          local_b8.m_message.pn.pi_ =
                               (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                          local_a0 = &local_c0;
                          pvVar1 = (iterator)0x1;
                          pvVar2 = (iterator)0x2;
                          boost::test_tools::tt_detail::report_assertion
                                    (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf744e5,
                                     (size_t)&local_70,0x6d9,&local_90,"20ULL << 20",&local_b8);
                          boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
                          local_398 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_390 = "";
                          local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
                          file_17.m_end = (iterator)0x6dc;
                          file_17.m_begin = (iterator)&local_398;
                          msg_17.m_end = pvVar2;
                          msg_17.m_begin = pvVar1;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                                     (size_t)&local_3a8,msg_17);
                          _cVar4 = 0x759470;
                          str_16._M_str = "0.5T";
                          str_16._M_len = 4;
                          oVar3 = ParseByteUnits(str_16,NOOP);
                          local_b8._0_8_ =
                               CONCAT71(local_b8._1_7_,
                                        ~oVar3.super__Optional_base<unsigned_long,_true,_true>.
                                         _M_payload.super__Optional_payload_base<unsigned_long>.
                                         _M_engaged) & 0xffffffffffffff01;
                          local_b8.m_message.px = (element_type *)0x0;
                          local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                          local_100._0_8_ = "!ParseByteUnits(\"0.5T\", noop)";
                          local_100._8_8_ = "";
                          local_90.m_empty = false;
                          local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
                          local_80 = boost::unit_test::lazy_ostream::inst;
                          local_78 = (_Storage<unsigned_long,_true> **)local_100;
                          local_3b8 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_3b0 = "";
                          pvVar1 = (iterator)0x1;
                          pvVar2 = (iterator)0x0;
                          boost::test_tools::tt_detail::report_assertion
                                    (&local_b8,&local_90,1,0,WARN,_cVar4,(size_t)&local_3b8,0x6dc);
                          boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
                          local_3c8 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_3c0 = "";
                          local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
                          file_18.m_end = (iterator)0x6df;
                          file_18.m_begin = (iterator)&local_3c8;
                          msg_18.m_end = pvVar2;
                          msg_18.m_begin = pvVar1;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                                     (size_t)&local_3d8,msg_18);
                          _cVar4 = 0x759544;
                          str_17._M_str = "18446744073709551615g";
                          str_17._M_len = 0x15;
                          oVar3 = ParseByteUnits(str_17,NOOP);
                          local_b8._0_8_ =
                               CONCAT71(local_b8._1_7_,
                                        ~oVar3.super__Optional_base<unsigned_long,_true,_true>.
                                         _M_payload.super__Optional_payload_base<unsigned_long>.
                                         _M_engaged) & 0xffffffffffffff01;
                          local_b8.m_message.px = (element_type *)0x0;
                          local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                          local_100._0_8_ = "!ParseByteUnits(\"18446744073709551615g\", noop)";
                          local_100._8_8_ = "";
                          local_90.m_empty = false;
                          local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
                          local_80 = boost::unit_test::lazy_ostream::inst;
                          local_78 = (_Storage<unsigned_long,_true> **)local_100;
                          local_3e8 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_3e0 = "";
                          pvVar1 = (iterator)0x1;
                          pvVar2 = (iterator)0x0;
                          boost::test_tools::tt_detail::report_assertion
                                    (&local_b8,&local_90,1,0,WARN,_cVar4,(size_t)&local_3e8,0x6df);
                          boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
                          local_3f8 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_3f0 = "";
                          local_408 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_400 = &boost::unit_test::basic_cstring<char_const>::null;
                          file_19.m_end = (iterator)0x6e2;
                          file_19.m_begin = (iterator)&local_3f8;
                          msg_19.m_end = pvVar2;
                          msg_19.m_begin = pvVar1;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                                     (size_t)&local_408,msg_19);
                          _cVar4 = 0x759614;
                          str_18._M_str = "1x";
                          str_18._M_len = 2;
                          oVar3 = ParseByteUnits(str_18,NOOP);
                          local_b8._0_8_ =
                               CONCAT71(local_b8._1_7_,
                                        ~oVar3.super__Optional_base<unsigned_long,_true,_true>.
                                         _M_payload.super__Optional_payload_base<unsigned_long>.
                                         _M_engaged) & 0xffffffffffffff01;
                          local_b8.m_message.px = (element_type *)0x0;
                          local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                          local_100._0_8_ = "!ParseByteUnits(\"1x\", noop)";
                          local_100._8_8_ = "";
                          local_90.m_empty = false;
                          local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
                          local_80 = boost::unit_test::lazy_ostream::inst;
                          local_78 = (_Storage<unsigned_long,_true> **)local_100;
                          local_418 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_410 = "";
                          boost::test_tools::tt_detail::report_assertion
                                    (&local_b8,&local_90,1,0,WARN,_cVar4,(size_t)&local_418,0x6e2);
                          boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            return;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseByteUnits)
{
    auto noop = ByteUnit::NOOP;

    // no multiplier
    BOOST_CHECK_EQUAL(ParseByteUnits("1", noop).value(), 1);
    BOOST_CHECK_EQUAL(ParseByteUnits("0", noop).value(), 0);

    BOOST_CHECK_EQUAL(ParseByteUnits("1k", noop).value(), 1000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("1K", noop).value(), 1ULL << 10);

    BOOST_CHECK_EQUAL(ParseByteUnits("2m", noop).value(), 2'000'000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("2M", noop).value(), 2ULL << 20);

    BOOST_CHECK_EQUAL(ParseByteUnits("3g", noop).value(), 3'000'000'000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("3G", noop).value(), 3ULL << 30);

    BOOST_CHECK_EQUAL(ParseByteUnits("4t", noop).value(), 4'000'000'000'000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("4T", noop).value(), 4ULL << 40);

    // check default multiplier
    BOOST_CHECK_EQUAL(ParseByteUnits("5", ByteUnit::K).value(), 5ULL << 10);

    // NaN
    BOOST_CHECK(!ParseByteUnits("", noop));
    BOOST_CHECK(!ParseByteUnits("foo", noop));

    // whitespace
    BOOST_CHECK(!ParseByteUnits("123m ", noop));
    BOOST_CHECK(!ParseByteUnits(" 123m", noop));

    // no +-
    BOOST_CHECK(!ParseByteUnits("-123m", noop));
    BOOST_CHECK(!ParseByteUnits("+123m", noop));

    // zero padding
    BOOST_CHECK_EQUAL(ParseByteUnits("020M", noop).value(), 20ULL << 20);

    // fractions not allowed
    BOOST_CHECK(!ParseByteUnits("0.5T", noop));

    // overflow
    BOOST_CHECK(!ParseByteUnits("18446744073709551615g", noop));

    // invalid unit
    BOOST_CHECK(!ParseByteUnits("1x", noop));
}